

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_write_res(nng_http *conn,nni_aio *aio)

{
  nng_err result;
  undefined1 local_58 [8];
  nni_iov iov [2];
  uint8_t *local_30;
  void *buf;
  size_t bufsz;
  
  result = http_prepare(conn,&local_30,(size_t *)&buf);
  if (result == NNG_OK) {
    if (local_30 != conn->buf) {
      nni_free((conn->res).data.buf,(conn->res).data.bufsz);
      (conn->res).data.buf = (char *)local_30;
      (conn->res).data.bufsz = (long)buf + 1;
    }
    conn->res_sent = true;
    local_58 = (undefined1  [8])local_30;
    iov[1].iov_buf = (void *)(conn->res).data.size;
    iov[0].iov_len = (size_t)(conn->res).data.data;
    nni_aio_set_iov(aio,((char *)iov[0].iov_len != (char *)0x0 && iov[1].iov_buf != (void *)0x0) + 1
                    ,(nni_iov *)local_58);
    nni_mtx_lock(&conn->mtx);
    http_wr_submit(conn,aio,HTTP_WR_RES);
    nni_mtx_unlock(&conn->mtx);
    return;
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

void
nni_http_write_res(nng_http *conn, nni_aio *aio)
{
	nng_err rv;
	void   *buf;
	size_t  bufsz;
	nni_iov iov[2];
	int     nio;

	if ((rv = http_prepare(conn, &buf, &bufsz)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	if (buf != conn->buf) {
		nni_free(conn->res.data.buf, conn->res.data.bufsz);
		conn->res.data.buf   = buf;
		conn->res.data.bufsz = bufsz + 1; // including \0
	}

	conn->res_sent = true;
	nio            = 1;
	iov[0].iov_len = bufsz;
	iov[0].iov_buf = buf;
	iov[1].iov_len = conn->res.data.size;
	iov[1].iov_buf = conn->res.data.data;
	if ((iov[1].iov_len > 0) && (iov[1].iov_buf != NULL)) {
		nio++;
	}
	nni_aio_set_iov(aio, nio, iov);

	nni_mtx_lock(&conn->mtx);
	http_wr_submit(conn, aio, HTTP_WR_RES);
	nni_mtx_unlock(&conn->mtx);
}